

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int execute_filter(archive_read *a,rar_filter *filter,rar_virtual_machine *vm,size_t pos)

{
  size_t pos_local;
  rar_virtual_machine *vm_local;
  rar_filter *filter_local;
  archive_read *a_local;
  
  if (filter->prog->fingerprint == 0x1d0e06077d) {
    a_local._4_4_ = execute_filter_delta(filter,vm);
  }
  else if (filter->prog->fingerprint == 0x35ad576887) {
    a_local._4_4_ = execute_filter_e8(filter,vm,pos,0);
  }
  else if (filter->prog->fingerprint == 0x393cd7e57e) {
    a_local._4_4_ = execute_filter_e8(filter,vm,pos,1);
  }
  else if (filter->prog->fingerprint == 0x951c2c5dc8) {
    a_local._4_4_ = execute_filter_rgb(filter,vm);
  }
  else if (filter->prog->fingerprint == 0xd8bc85e701) {
    a_local._4_4_ = execute_filter_audio(filter,vm);
  }
  else {
    archive_set_error(&a->archive,0x54,"No support for RAR VM program filter");
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
execute_filter(struct archive_read *a, struct rar_filter *filter, struct rar_virtual_machine *vm, size_t pos)
{
  if (filter->prog->fingerprint == 0x1D0E06077D)
    return execute_filter_delta(filter, vm);
  if (filter->prog->fingerprint == 0x35AD576887)
    return execute_filter_e8(filter, vm, pos, 0);
  if (filter->prog->fingerprint == 0x393CD7E57E)
    return execute_filter_e8(filter, vm, pos, 1);
  if (filter->prog->fingerprint == 0x951C2C5DC8)
    return execute_filter_rgb(filter, vm);
  if (filter->prog->fingerprint == 0xD8BC85E701)
    return execute_filter_audio(filter, vm);

  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT, "No support for RAR VM program filter");
  return 0;
}